

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O2

int partition_plane_context(MACROBLOCKD *xd,int mi_row,int mi_col,BLOCK_SIZE bsize)

{
  uint uVar1;
  undefined7 in_register_00000009;
  
  uVar1 = ""[CONCAT71(in_register_00000009,bsize) & 0xffffffff] - 1;
  return (uint)(((uint)(int)xd->above_partition_context[mi_col] >> (uVar1 & 0x1f) & 1) != 0) +
         ((uint)(int)xd->left_partition_context[mi_row & 0x1f] >> ((byte)uVar1 & 0x1f) & 1) * 2 +
         (uint)""[CONCAT71(in_register_00000009,bsize) & 0xffffffff] * 4 + -4;
}

Assistant:

static inline int partition_plane_context(const MACROBLOCKD *xd, int mi_row,
                                          int mi_col, BLOCK_SIZE bsize) {
  const PARTITION_CONTEXT *above_ctx = xd->above_partition_context + mi_col;
  const PARTITION_CONTEXT *left_ctx =
      xd->left_partition_context + (mi_row & MAX_MIB_MASK);
  // Minimum partition point is 8x8. Offset the bsl accordingly.
  const int bsl = mi_size_wide_log2[bsize] - mi_size_wide_log2[BLOCK_8X8];
  int above = (*above_ctx >> bsl) & 1, left = (*left_ctx >> bsl) & 1;

  assert(mi_size_wide_log2[bsize] == mi_size_high_log2[bsize]);
  assert(bsl >= 0);

  return (left * 2 + above) + bsl * PARTITION_PLOFFSET;
}